

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void get_header(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
               cio_read_buffer *buffer,size_t num_bytes)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  cio_error err_00;
  ulong extraout_RAX;
  ushort uVar6;
  char *reason;
  cio_websocket_status_code status_code;
  byte bVar7;
  
  if ((err != CIO_SUCCESS) && (get_header_cold_1(), (extraout_RAX & 1) == 0)) {
    return;
  }
  bVar1 = *buffer->fetch_ptr;
  buffer->fetch_ptr = buffer->fetch_ptr + num_bytes;
  bVar2 = bVar1 >> 7;
  uVar5 = *(uint *)((long)handler_context + 0x10);
  uVar6 = (ushort)uVar5;
  *(ushort *)((long)handler_context + 0x10) = uVar6 & 0xfffe | (ushort)bVar2;
  if ((bVar1 & 0x70) != 0) {
    get_header_cold_2();
    return;
  }
  uVar4 = bVar1 & 0xf;
  bVar7 = (byte)uVar4;
  if ((char)bVar1 < '\0' || bVar7 < 8) {
    if ((char)bVar1 < '\0') {
      if (bVar7 == 0) {
        uVar5 = (uVar5 & 0xffff) >> 5;
        if ((uVar5 & 0xf) == 0) goto LAB_00105458;
        uVar6 = (uVar6 & 0xfe00 | (ushort)bVar2) + ((ushort)uVar5 & 0xf) * 2;
      }
      else {
        if (bVar7 < 8 && (uVar5 & 0x1e0) != 0) goto LAB_0010544a;
        uVar6 = uVar6 & 0xffe0 | (ushort)bVar2 | (ushort)(byte)(bVar1 * '\x02');
      }
    }
    else {
      if (bVar7 == 0) {
        uVar5 = (uVar5 & 0xffff) >> 5;
        uVar4 = (ushort)uVar5 & 0xf;
        if ((uVar5 & 0xf) == 0) {
LAB_00105458:
          bVar3 = false;
          reason = "got continuation frame without correct start frame";
          goto LAB_001053a7;
        }
        uVar6 = uVar6 & 0xffe0;
      }
      else {
        if ((uVar5 & 0x1e0) != 0) {
LAB_0010544a:
          reason = "got non-continuation frame within fragmented stream";
          goto LAB_00105451;
        }
        uVar6 = uVar6 & 0xfe00 | uVar4 << 5;
      }
      uVar6 = uVar6 + uVar4 * 2;
    }
    *(ushort *)((long)handler_context + 0x10) = uVar6;
    bVar3 = true;
    reason = (char *)0x0;
  }
  else {
    reason = "got fragmented control frame";
LAB_00105451:
    bVar3 = false;
  }
LAB_001053a7:
  if (bVar3) {
    err_00 = cio_buffered_stream_read_at_least
                       (buffered_stream,buffer,1,get_first_length,handler_context);
    if (err_00 == CIO_SUCCESS) {
      return;
    }
    reason = "error while start reading websocket frame length";
    status_code = CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR;
  }
  else {
    err_00 = CIO_PROTOCOL_NOT_SUPPORTED;
    status_code = CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR;
  }
  handle_error((cio_websocket *)handler_context,err_00,status_code,reason);
  return;
}

Assistant:

static void get_header(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	(void)num_bytes;
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	if (cio_unlikely(handled_read_error(websocket, err))) {
		return;
	}

	uint8_t *ptr = cio_read_buffer_get_read_ptr(buffer);
	uint8_t field = *ptr;
	cio_read_buffer_consume(buffer, num_bytes);

	websocket->ws_private.ws_flags.fin = (field & WS_HEADER_FIN) == WS_HEADER_FIN;

	uint8_t rsv_field = field & RSV_MASK;
	if (cio_unlikely(rsv_field != 0)) {
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, "reserved bit set in frame");
		return;
	}

	const char *err_msg = handle_fin(websocket, field);
	if (cio_unlikely(err_msg != NULL)) {
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, err_msg);
		return;
	}

	err = cio_buffered_stream_read_at_least(buffered_stream, buffer, 1, get_first_length, websocket);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "error while start reading websocket frame length");
	}
}